

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O1

void write_parser_tables(Grammar *g,char *tag,File *file)

{
  byte *pbVar1;
  Rule **ppRVar2;
  Rule *pRVar3;
  Code *pCVar4;
  Code *pCVar5;
  Term *pTVar6;
  State *pSVar7;
  ScanStateTransition *pSVar8;
  Action *pAVar9;
  ScanState **ppSVar10;
  Elem *pEVar11;
  char *pcVar12;
  D_Pass *pDVar13;
  uint8 **ppuVar14;
  OffsetEntry **__ptr;
  bool bVar15;
  byte bVar16;
  undefined4 uVar17;
  char cVar18;
  uint uVar19;
  Production *pPVar20;
  void *pvVar21;
  void *pvVar22;
  char *pcVar23;
  Action *pAVar24;
  uint *puVar25;
  size_t sVar26;
  State *pSVar27;
  char *pcVar28;
  FILE *pFVar29;
  uint8 *puVar30;
  long lVar31;
  ScanState *pSVar32;
  Rule *pRVar33;
  OffsetEntry *pOVar34;
  undefined8 uVar35;
  uint uVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  int iVar40;
  uint uVar41;
  Rule *pRVar42;
  void **ppvVar43;
  code *pcVar44;
  char **ppcVar45;
  FILE *pFVar46;
  uint uVar47;
  ulong uVar48;
  char *pcVar49;
  ulong uVar50;
  void *t;
  int iVar51;
  long lVar52;
  ulong uVar53;
  char *local_5a0;
  char *local_580;
  char *local_570;
  VecState er_hash;
  char final_code [256];
  char speculative_code [256];
  char pass_code [256];
  char fname [256];
  VecAction shift_hash;
  
  er_hash.n = 0;
  er_hash.v = (State **)0x0;
  pRVar42 = (Rule *)0x0;
  g->scanner_block_size = (int)(0x100 / (long)g->scanner_blocks);
  pFVar46 = file->fp;
  pPVar20 = lookup_production(g,"_",1);
  if (pPVar20 != (Production *)0x0) {
    pRVar42 = *(pPVar20->rules).v;
    myfprintf(pFVar46,"int d_speculative_reduction_code_%d_%d_%s%s;\n",(ulong)pRVar42->prod->index,
              (ulong)pRVar42->index,tag,
              "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)");
    g->write_line = g->write_line + 1;
    myfprintf(pFVar46,"int d_final_reduction_code_%d_%d_%s%s;\n",(ulong)pRVar42->prod->index,
              (ulong)pRVar42->index,tag,
              "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)");
    g->write_line = g->write_line + 1;
    myfprintf(pFVar46,"extern D_ReductionCode d_pass_code_%d_%d_%s[];\n",(ulong)pRVar42->prod->index
             );
    g->write_line = g->write_line + 1;
    if (0 < (int)(pRVar42->pass_code).n) {
      uVar50 = 0;
      do {
        myfprintf(pFVar46,"int d_pass_code_%d_%d_%d_%s%s;\n",uVar50,(ulong)pRVar42->prod->index,
                  (ulong)pRVar42->index,tag,
                  "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)");
        g->write_line = g->write_line + 1;
        uVar36 = (int)uVar50 + 1;
        uVar50 = (ulong)uVar36;
      } while ((int)uVar36 < (int)(pRVar42->pass_code).n);
    }
  }
  if (0 < (int)(g->productions).n) {
    lVar31 = 0;
    do {
      pPVar20 = (g->productions).v[lVar31];
      uVar19 = (pPVar20->rules).n;
      uVar36 = uVar19 - 1;
      if (-1 < (int)uVar36) {
        ppRVar2 = (pPVar20->rules).v;
        uVar50 = (ulong)uVar36;
        do {
          if (0 < (long)uVar50) {
            pRVar33 = ppRVar2[uVar50];
            uVar48 = 0;
            do {
              pRVar3 = ppRVar2[uVar48];
              if ((((((pRVar33->elems).n == (pRVar3->elems).n) &&
                    ((pRVar33->speculative_code).code == (pRVar3->speculative_code).code)) &&
                   ((pRVar33->final_code).code == (pRVar3->final_code).code)) &&
                  ((pRVar33->op_priority == pRVar3->op_priority &&
                   (pRVar33->op_assoc == pRVar3->op_assoc)))) &&
                 ((pRVar33->rule_priority == pRVar3->rule_priority &&
                  ((pRVar33->rule_assoc == pRVar3->rule_assoc &&
                   (pRVar33->action_index == pRVar3->action_index)))))) {
                uVar36 = (pRVar33->pass_code).n;
                if (uVar36 == (pRVar3->pass_code).n) {
                  if (0 < (int)uVar36) {
                    uVar53 = 0;
                    do {
                      pCVar4 = (pRVar33->pass_code).v[uVar53];
                      pCVar5 = (pRVar3->pass_code).v[uVar53];
                      if (pCVar4 == (Code *)0x0) {
                        if (pCVar5 != (Code *)0x0) goto LAB_00133f13;
                      }
                      else if ((pCVar5 == (Code *)0x0) || (pCVar4->code != pCVar5->code))
                      goto LAB_00133f13;
                      uVar53 = uVar53 + 1;
                      if (uVar36 == uVar53) break;
                    } while( true );
                  }
                  pRVar33->same_reduction = pRVar3;
                  break;
                }
              }
LAB_00133f13:
              uVar48 = uVar48 + 1;
            } while (uVar48 != uVar50);
          }
          bVar15 = 0 < (long)uVar50;
          uVar50 = uVar50 - 1;
        } while (bVar15);
      }
      if (0 < (int)uVar19) {
        lVar52 = 0;
        do {
          pRVar33 = (pPVar20->rules).v[lVar52];
          if (pRVar33->same_reduction == (Rule *)0x0) {
            if ((pRVar33->speculative_code).code == (char *)0x0) {
              if ((pRVar42 != (Rule *)0x0) && ((pRVar42->speculative_code).code != (char *)0x0)) {
                uVar36 = pRVar42->prod->index;
                uVar47 = pRVar42->index;
                goto LAB_00133f74;
              }
              speculative_code._4_4_ = speculative_code._4_4_ & 0xffffff00;
              builtin_strncpy(speculative_code,"NULL",4);
            }
            else {
              uVar36 = pRVar33->prod->index;
              uVar47 = pRVar33->index;
LAB_00133f74:
              snprintf(speculative_code,0xff,"d_speculative_reduction_code_%d_%d_%s",(ulong)uVar36,
                       (ulong)uVar47,tag);
            }
            if ((pRVar33->final_code).code == (char *)0x0) {
              if ((pRVar42 != (Rule *)0x0) && ((pRVar42->final_code).code != (char *)0x0)) {
                uVar47 = pRVar42->prod->index;
                uVar36 = pRVar42->index;
                goto LAB_00133fdb;
              }
              final_code._4_4_ = final_code._4_4_ & 0xffffff00;
              builtin_strncpy(final_code,"NULL",4);
            }
            else {
              uVar47 = pRVar33->prod->index;
              uVar36 = pRVar33->index;
LAB_00133fdb:
              snprintf(final_code,0xff,"d_final_reduction_code_%d_%d_%s",(ulong)uVar47,(ulong)uVar36
                       ,tag);
            }
            if ((pRVar33->speculative_code).code != (char *)0x0) {
              snprintf(fname,0xff,"int d_speculative_reduction_code_%d_%d_%s%s ",
                       (ulong)pRVar33->prod->index,(ulong)pRVar33->index,tag,
                       "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)"
                      );
              write_code(file,g,pRVar33,speculative_code,(pRVar33->speculative_code).code,fname,
                         (pRVar33->speculative_code).line,g->pathname);
            }
            if ((pRVar33->final_code).code != (char *)0x0) {
              snprintf(fname,0xff,"int d_final_reduction_code_%d_%d_%s%s ",
                       (ulong)pRVar33->prod->index,(ulong)pRVar33->index,tag,
                       "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)"
                      );
              write_code(file,g,pRVar33,final_code,(pRVar33->final_code).code,fname,
                         (pRVar33->final_code).line,g->pathname);
            }
            uVar19 = (pRVar33->pass_code).n;
            if (0 < (int)uVar19) {
              uVar50 = 0;
              do {
                if ((pRVar33->pass_code).v[uVar50] != (Code *)0x0) {
                  snprintf(fname,0xff,"int d_pass_code_%d_%d_%d_%s%s ",uVar50 & 0xffffffff,
                           (ulong)pRVar33->prod->index,(ulong)pRVar33->index,tag,
                           "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)"
                          );
                  snprintf((char *)&shift_hash,0xff,"int d_pass_code_%d_%d_%d_%s",
                           uVar50 & 0xffffffff,(ulong)pRVar33->prod->index,(ulong)pRVar33->index,tag
                          );
                  pCVar4 = (pRVar33->pass_code).v[uVar50];
                  write_code(file,g,pRVar33,(char *)&shift_hash,pCVar4->code,fname,pCVar4->line,
                             g->pathname);
                }
                uVar50 = uVar50 + 1;
                uVar19 = (pRVar33->pass_code).n;
              } while ((long)uVar50 < (long)(int)uVar19);
            }
            if ((uVar19 == 0) && ((pRVar42 == (Rule *)0x0 || ((pRVar42->pass_code).n == 0)))) {
              builtin_strncpy(pass_code,"NULL",5);
              uVar50 = 0;
            }
            else {
              uVar50 = (ulong)uVar19;
              if ((pRVar42 != (Rule *)0x0) &&
                 (uVar36 = (pRVar42->pass_code).n, uVar50 = (ulong)uVar36,
                 (int)uVar36 <= (int)uVar19)) {
                uVar50 = (ulong)uVar19;
              }
              if (uVar19 == 0) {
                snprintf(pass_code,0xff,"d_pass_code_%d_%d_%s",(ulong)pRVar42->prod->index,
                         (ulong)pRVar42->index,tag);
              }
              else {
                snprintf(pass_code,0xff,"d_pass_code_%d_%d_%s",(ulong)pRVar33->prod->index,
                         (ulong)pRVar33->index,tag);
                myfprintf(pFVar46,"D_ReductionCode %s[] = {",pass_code);
                if (0 < (int)uVar50) {
                  lVar38 = (long)((int)uVar50 + -1);
                  uVar48 = 0;
                  do {
                    if (((long)uVar48 < (long)(int)(pRVar33->pass_code).n) &&
                       ((pRVar33->pass_code).v[uVar48] != (Code *)0x0)) {
                      uVar36 = pRVar33->prod->index;
                      uVar47 = pRVar33->index;
LAB_001342b4:
                      pcVar49 = "";
                      if ((long)uVar48 < lVar38) {
                        pcVar49 = ", ";
                      }
                      myfprintf(pFVar46,"d_pass_code_%d_%d_%d_%s%s",uVar48 & 0xffffffff,
                                (ulong)uVar36,(ulong)uVar47,tag,pcVar49);
                    }
                    else {
                      if ((pRVar42 != (Rule *)0x0) &&
                         (((long)uVar48 < (long)(int)(pRVar42->pass_code).n &&
                          ((pRVar42->pass_code).v[uVar48] != (Code *)0x0)))) {
                        uVar36 = pRVar42->prod->index;
                        uVar47 = pRVar42->index;
                        goto LAB_001342b4;
                      }
                      pcVar49 = "";
                      if ((long)uVar48 < lVar38) {
                        pcVar49 = ", ";
                      }
                      myfprintf(pFVar46,"NULL%s",pcVar49);
                    }
                    uVar48 = uVar48 + 1;
                  } while (uVar50 != uVar48);
                }
                myfprintf(pFVar46,"};\n\n");
                g->write_line = g->write_line + 2;
              }
            }
            pcVar49 = make_name("d_reduction_%d_%s",(ulong)pRVar33->index,tag);
            start_struct_fn(file,0x38,"D_Reduction",pcVar49,"");
            if (file->binary == 0) {
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              myfprintf(file->fp,"%d",(ulong)(pRVar33->elems).n);
            }
            else {
              *(short *)(file->tables).cur = (short)(pRVar33->elems).n;
            }
            if (file->binary == 0) {
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              myfprintf(file->fp,"%d",(ulong)pRVar33->prod->index);
            }
            else {
              *(short *)((file->tables).cur + 2) = (short)pRVar33->prod->index;
            }
            if (file->binary == 0) {
              myfprintf(pFVar46,", %s",speculative_code);
              myfprintf(pFVar46,", %s",final_code);
            }
            else {
              if (((pRVar33->prod->field_0x3c & 0x1c) == 0) && (-1 < pRVar33->action_index)) {
                pcVar49 = (file->tables).cur;
                if (pcVar49 == (char *)0x0) {
                  ppvVar43 = (void **)0x0;
                }
                else {
                  ppvVar43 = (void **)(pcVar49 + 8);
                }
                add_struct_ptr_member_fn(file,ppvVar43,&spec_code_entry,"%s");
                pcVar49 = (file->tables).cur;
                if (pcVar49 == (char *)0x0) {
                  ppvVar43 = (void **)0x0;
                }
                else {
                  ppvVar43 = (void **)(pcVar49 + 0x10);
                }
                pOVar34 = &final_code_entry;
              }
              else {
                pcVar49 = (file->tables).cur;
                if (pcVar49 == (char *)0x0) {
                  ppvVar43 = (void **)0x0;
                }
                else {
                  ppvVar43 = (void **)(pcVar49 + 8);
                }
                add_struct_ptr_member_fn(file,ppvVar43,&null_entry,"%s");
                pcVar49 = (file->tables).cur;
                if (pcVar49 == (char *)0x0) {
                  ppvVar43 = (void **)0x0;
                }
                else {
                  ppvVar43 = (void **)(pcVar49 + 0x10);
                }
                pOVar34 = &null_entry;
              }
              add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
            }
            if (file->binary == 0) {
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              myfprintf(file->fp,"%d",(ulong)pRVar33->op_assoc);
            }
            else {
              *(short *)((file->tables).cur + 0x18) = (short)pRVar33->op_assoc;
            }
            if (file->binary == 0) {
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              myfprintf(file->fp,"%d",(ulong)pRVar33->rule_assoc);
            }
            else {
              *(short *)((file->tables).cur + 0x1a) = (short)pRVar33->rule_assoc;
            }
            if (file->binary == 0) {
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              myfprintf(file->fp,"%d",(ulong)(uint)pRVar33->op_priority);
            }
            else {
              *(int *)((file->tables).cur + 0x1c) = pRVar33->op_priority;
            }
            if (file->binary == 0) {
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              myfprintf(file->fp,"%d",(ulong)(uint)pRVar33->rule_priority);
            }
            else {
              *(int *)((file->tables).cur + 0x20) = pRVar33->rule_priority;
            }
            if (file->binary == 0) {
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              uVar48 = 0xffffffff;
              if ((pRVar33->prod->field_0x3c & 0x1c) == 0) {
                uVar48 = (ulong)(uint)pRVar33->action_index;
              }
              myfprintf(file->fp,"%d",uVar48);
            }
            else {
              iVar40 = -1;
              if ((pRVar33->prod->field_0x3c & 0x1c) == 0) {
                iVar40 = pRVar33->action_index;
              }
              *(int *)((file->tables).cur + 0x24) = iVar40;
            }
            if (file->binary == 0) {
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              myfprintf(file->fp,"%d",uVar50);
            }
            else {
              *(int *)((file->tables).cur + 0x28) = (int)uVar50;
            }
            if (file->binary == 0) {
              myfprintf(pFVar46,", %s",pass_code);
            }
            else {
              pcVar49 = (file->tables).cur;
              if (pcVar49 == (char *)0x0) {
                ppvVar43 = (void **)0x0;
              }
              else {
                ppvVar43 = (void **)(pcVar49 + 0x30);
              }
              add_struct_ptr_member_fn(file,ppvVar43,&null_entry,"%s");
            }
            if (file->binary == 0) {
              myfprintf(file->fp,"};%s","\n");
            }
            else {
              ppcVar45 = &(file->tables).cur;
              *ppcVar45 = *ppcVar45 + 0x38;
            }
            g->write_line = g->write_line + 1;
          }
          lVar52 = lVar52 + 1;
        } while (lVar52 < (int)(pPVar20->rules).n);
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 < (int)(g->productions).n);
  }
  if ((g->terminals).n != 0) {
    uVar50 = 0;
    do {
      pTVar6 = (g->terminals).v[uVar50];
      pPVar20 = pTVar6->regex_production;
      if ((pPVar20 == (Production *)0x0) ||
         (pRVar42 = *(pPVar20->rules).v, (pRVar42->speculative_code).code == (char *)0x0)) {
        final_code._4_4_ = final_code._4_4_ & 0xffffff00;
        builtin_strncpy(final_code,"NULL",4);
      }
      else {
        if (file->binary != 0) {
          __assert_fail("!fp->binary",
                        "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                        ,0x24d,"void write_scanner_data(File *, Grammar *, char *)");
        }
        snprintf(final_code,0xff,"d_speculative_reduction_code_%d_%d_%s",(ulong)pPVar20->index,
                 (ulong)pRVar42->index,tag);
      }
      pPVar20 = pTVar6->regex_production;
      if (pPVar20 == (Production *)0x0) {
        iVar40 = -1;
      }
      else {
        iVar40 = (*(pPVar20->rules).v)->action_index;
      }
      pcVar49 = make_name("d_shift_%d_%s",uVar50 & 0xffffffff,tag);
      start_struct_fn(file,0x18,"D_Shift",pcVar49,"");
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",(ulong)((g->productions).n + (g->terminals).v[uVar50]->index));
      }
      else {
        *(short *)(file->tables).cur =
             (short)(g->productions).n + (short)(g->terminals).v[uVar50]->index;
      }
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",(ulong)((byte)(g->terminals).v[uVar50]->field_0x2c & 7));
      }
      else {
        (file->tables).cur[2] = (g->terminals).v[uVar50]->field_0x2c & 7;
      }
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",(ulong)(g->terminals).v[uVar50]->op_assoc);
      }
      else {
        (file->tables).cur[3] = (char)(g->terminals).v[uVar50]->op_assoc;
      }
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",(ulong)(uint)(g->terminals).v[uVar50]->op_priority);
      }
      else {
        *(int *)((file->tables).cur + 4) = (g->terminals).v[uVar50]->op_priority;
      }
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",(ulong)(uint)(g->terminals).v[uVar50]->term_priority);
      }
      else {
        *(int *)((file->tables).cur + 8) = (g->terminals).v[uVar50]->term_priority;
      }
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",0);
        myfprintf(file->fp,", %s",final_code);
      }
      else {
        pcVar49 = (file->tables).cur;
        *(int *)(pcVar49 + 0xc) = iVar40;
        if (pcVar49 == (char *)0x0) {
          ppvVar43 = (void **)0x0;
        }
        else {
          ppvVar43 = (void **)(pcVar49 + 0x10);
        }
        add_struct_ptr_member_fn(file,ppvVar43,&spec_code_entry,"%s");
      }
      if (file->binary == 0) {
        myfprintf(file->fp,"};%s","\n");
      }
      else {
        ppcVar45 = &(file->tables).cur;
        *ppcVar45 = *ppcVar45 + 0x18;
      }
      g->write_line = g->write_line + 1;
      if (((g->terminals).v[uVar50]->field_0x2c & 0x10) != 0) {
        pcVar49 = make_name("d_tshift_%d_%s",uVar50 & 0xffffffff,tag);
        start_struct_fn(file,0x18,"D_Shift",pcVar49,"");
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)((g->productions).n + (g->terminals).v[uVar50]->index));
        }
        else {
          *(short *)(file->tables).cur =
               (short)(g->productions).n + (short)(g->terminals).v[uVar50]->index;
        }
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",3);
        }
        else {
          (file->tables).cur[2] = '\x03';
        }
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)(g->terminals).v[uVar50]->op_assoc);
        }
        else {
          (file->tables).cur[3] = (char)(g->terminals).v[uVar50]->op_assoc;
        }
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)(uint)(g->terminals).v[uVar50]->op_priority);
        }
        else {
          *(int *)((file->tables).cur + 4) = (g->terminals).v[uVar50]->op_priority;
        }
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)(uint)(g->terminals).v[uVar50]->term_priority);
        }
        else {
          *(int *)((file->tables).cur + 8) = (g->terminals).v[uVar50]->term_priority;
        }
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",0);
          myfprintf(file->fp,", %s",final_code);
        }
        else {
          pcVar49 = (file->tables).cur;
          *(int *)(pcVar49 + 0xc) = iVar40;
          if (pcVar49 == (char *)0x0) {
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x10);
          }
          add_struct_ptr_member_fn(file,ppvVar43,&spec_code_entry,"%s");
        }
        if (file->binary == 0) {
          myfprintf(file->fp,"};%s","\n");
        }
        else {
          ppcVar45 = &(file->tables).cur;
          *ppcVar45 = *ppcVar45 + 0x18;
        }
        g->write_line = g->write_line + 1;
      }
      uVar50 = uVar50 + 1;
    } while (uVar50 < (g->terminals).n);
  }
  if (file->binary == 0) {
    myfprintf(file->fp,"%s","\n");
  }
  g->write_line = g->write_line + 1;
  uVar50 = (ulong)(g->states).n;
  uVar36 = 0;
  if (uVar50 != 0) {
    uVar48 = 0;
    uVar36 = 0;
    do {
      uVar36 = uVar36 + ((g->states).v[uVar48]->scanner).states.n * g->scanner_blocks;
      uVar48 = uVar48 + 1;
    } while (uVar50 != uVar48);
  }
  pvVar21 = malloc((ulong)(uVar36 + (uVar36 == 0)) << 5);
  lVar31 = 8;
  do {
    pcVar49 = speculative_code + lVar31 + 0xf8;
    pcVar49[0] = '\0';
    pcVar49[1] = '\0';
    pcVar49[2] = '\0';
    pcVar49[3] = '\0';
    pcVar49 = pass_code + lVar31;
    pcVar49[0] = '\0';
    pcVar49[1] = '\0';
    pcVar49[2] = '\0';
    pcVar49[3] = '\0';
    pcVar49[4] = '\0';
    pcVar49[5] = '\0';
    pcVar49[6] = '\0';
    pcVar49[7] = '\0';
    pcVar49 = pass_code + lVar31 + 0xf8;
    pcVar49[0] = '\0';
    pcVar49[1] = '\0';
    pcVar49[2] = '\0';
    pcVar49[3] = '\0';
    pcVar49 = fname + lVar31;
    pcVar49[0] = '\0';
    pcVar49[1] = '\0';
    pcVar49[2] = '\0';
    pcVar49[3] = '\0';
    pcVar49[4] = '\0';
    pcVar49[5] = '\0';
    pcVar49[6] = '\0';
    pcVar49[7] = '\0';
    lVar31 = lVar31 + 0x28;
  } while (lVar31 != 0xa8);
  scanner_block_fns.data[0] = (void *)(long)g->scanner_block_size;
  shift_hash.n = 0;
  shift_hash.v = (Action **)0x0;
  scanner_block_fns.data[1] = g;
  trans_scanner_block_fns.data[0] = scanner_block_fns.data[0];
  trans_scanner_block_fns.data[1] = g;
  if (uVar50 != 0) {
    uVar50 = 0;
    uVar47 = 0;
    do {
      pSVar7 = (g->states).v[uVar50];
      if (pSVar7->same_shifts == (State *)0x0) {
        if ((pSVar7->scanner).transitions.n != 0) {
          uVar48 = 0;
          do {
            pSVar8 = (pSVar7->scanner).transitions.v[uVar48];
            pcVar49 = make_name("d_accepts_diff_%d_%d_%s",uVar50 & 0xffffffff,uVar48 & 0xffffffff,
                                tag);
            start_array_fn(file,8,"","D_Shift *",pcVar49,"",0,"");
            if ((pSVar8->accepts_diff).n != 0) {
              uVar53 = 0;
              do {
                pAVar9 = (pSVar8->accepts_diff).v[uVar53];
                pcVar49 = "d_shift_%d_%s";
                if (pAVar9->kind == ACTION_SHIFT_TRAILING) {
                  pcVar49 = "d_tshift_%d_%s";
                }
                pOVar34 = get_offset(file,pcVar49,(ulong)pAVar9->term->index);
                add_array_ptr_member_fn(file,pOVar34,"&%s%s",0);
                uVar53 = uVar53 + 1;
              } while (uVar53 < (pSVar8->accepts_diff).n);
            }
            if (file->binary == 0) {
              myfprintf(file->fp,"%d%s",0,"");
            }
            else {
              file->n_elems = file->n_elems + 1;
              make_room_in_buf(&file->tables,(long)file->elem_size);
              pcVar49 = (file->tables).cur;
              pcVar49[0] = '\0';
              pcVar49[1] = '\0';
              pcVar49[2] = '\0';
              pcVar49[3] = '\0';
              pcVar49[4] = '\0';
              pcVar49[5] = '\0';
              pcVar49[6] = '\0';
              pcVar49[7] = '\0';
              ppcVar45 = &(file->tables).cur;
              *ppcVar45 = *ppcVar45 + file->elem_size;
            }
            end_array(file,"\n");
            g->write_line = g->write_line + 2;
            uVar48 = uVar48 + 1;
            uVar41 = (pSVar7->scanner).transitions.n;
          } while (uVar48 < uVar41);
          if (uVar41 != 0) {
            pcVar49 = make_name("d_accepts_diff_%d_%s",uVar50 & 0xffffffff,tag);
            start_array_fn(file,8,"","D_Shift **",pcVar49,"",0,"\n");
            if ((pSVar7->scanner).transitions.n != 0) {
              uVar48 = 0;
              do {
                iVar40 = (int)uVar48;
                pOVar34 = get_offset(file,"d_accepts_diff_%d_%d_%s",uVar50 & 0xffffffff,uVar48,tag);
                add_array_ptr_member_fn
                          (file,pOVar34,"%s%s",(uint)(iVar40 == (pSVar7->scanner).transitions.n - 1)
                          );
                if (file->binary == 0) {
                  myfprintf(file->fp,"%s","\n");
                }
                uVar41 = (pSVar7->scanner).transitions.n;
                if (iVar40 != uVar41 - 1) {
                  g->write_line = g->write_line + 1;
                }
                uVar48 = (ulong)(iVar40 + 1U);
              } while (iVar40 + 1U < uVar41);
            }
            end_array(file,"\n\n");
            g->write_line = g->write_line + 3;
          }
        }
        uVar41 = (pSVar7->scanner).states.n;
        if (((0xfe < uVar41) || (local_580 = pass_code, 0xfe < (pSVar7->scanner).transitions.n)) &&
           ((0x7e7f < uVar41 ||
            (local_580 = pass_code + 0x28, 0x7e7f < (pSVar7->scanner).transitions.n)))) {
          local_580 = pass_code + 0x78;
        }
        if (((0xfe < uVar41) || (local_570 = fname, 0xfe < (pSVar7->scanner).transitions.n)) &&
           ((0x7e7f < uVar41 || (local_570 = fname + 0x28, 0x7e7f < (pSVar7->scanner).transitions.n)
            ))) {
          local_570 = fname + 0x78;
        }
        if (uVar41 != 0) {
          uVar48 = 0;
          do {
            if (pSVar7->same_shifts == (State *)0x0) {
              if (0 < g->scanner_blocks) {
                uVar41 = 0;
                do {
                  lVar52 = (ulong)uVar47 * 0x20;
                  *(uint *)((long)pvVar21 + lVar52) = pSVar7->index;
                  *(int *)((long)pvVar21 + lVar52 + 4) = (int)uVar48;
                  *(uint *)((long)pvVar21 + lVar52 + 8) = uVar41;
                  ppSVar10 = (pSVar7->scanner).states.v;
                  lVar31 = (long)(int)uVar41 * (long)g->scanner_block_size;
                  *(ScanState ***)((long)pvVar21 + lVar52 + 0x10) = ppSVar10[uVar48]->chars + lVar31
                  ;
                  *(ScanStateTransition ***)((long)pvVar21 + lVar52 + 0x18) =
                       ppSVar10[uVar48]->transition + lVar31;
                  uVar47 = uVar47 + 1;
                  if (uVar36 < uVar47) {
                    __assert_fail("ivsblock <= nvsblocks",
                                  "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                                  ,0x2b4,"void write_scanner_data(File *, Grammar *, char *)");
                  }
                  t = (void *)(lVar52 + (long)pvVar21);
                  pvVar22 = set_add_fn(local_580,t,&scanner_block_fns);
                  if (t == pvVar22) {
                    uVar37 = (pSVar7->scanner).states.n;
                    if (((0xfe < uVar37) || (iVar40 = 1, 0xfe < (pSVar7->scanner).transitions.n)) &&
                       ((0x7e7f < uVar37 || (iVar40 = 2, 0x7e7f < (pSVar7->scanner).transitions.n)))
                       ) {
                      iVar40 = 4;
                    }
                    pcVar49 = "unsigned char";
                    if (iVar40 != 1) {
                      if (iVar40 == 4) {
                        pcVar49 = "unsigned int";
                      }
                      else if (iVar40 == 2) {
                        pcVar49 = "unsigned short";
                      }
                      else {
                        d_fail("bad case");
                        pcVar49 = "";
                      }
                    }
                    pcVar23 = make_name("d_scanner_%d_%d_%d_%s",uVar50,uVar48 & 0xffffffff,
                                        (ulong)uVar41,tag);
                    start_array_fn(file,iVar40,"",pcVar49,pcVar23,"SCANNER_BLOCK_SIZE",0x40,"\n");
                    iVar51 = g->scanner_block_size;
                    if (0 < iVar51) {
                      uVar37 = 0;
                      do {
                        pcVar44 = unsigned_char_copy;
                        if (iVar40 != 1) {
                          if (iVar40 == 4) {
                            pcVar44 = unsigned_int_copy;
                          }
                          else if (iVar40 == 2) {
                            pcVar44 = unsigned_short_copy;
                          }
                          else {
                            d_fail("bad case");
                            pcVar44 = (CopyFuncType)0x0;
                          }
                        }
                        pSVar32 = (pSVar7->scanner).states.v[uVar48]->chars
                                  [iVar51 * uVar41 + uVar37];
                        if (pSVar32 == (ScanState *)0x0) {
                          pcVar49 = (char *)0x0;
                        }
                        else {
                          pcVar49 = (char *)(ulong)(pSVar32->index + 1);
                        }
                        add_array_member_fn(file,pcVar44,pcVar49,
                                            (uint)(uVar37 == g->scanner_block_size),(int)pcVar23);
                        if ((~uVar37 & 0xf) == 0) {
                          if (file->binary == 0) {
                            myfprintf(file->fp,"%s","\n");
                          }
                          g->write_line = g->write_line + 1;
                        }
                        uVar37 = uVar37 + 1;
                        iVar51 = g->scanner_block_size;
                      } while ((int)uVar37 < iVar51);
                    }
                    end_array(file,"\n\n");
                    g->write_line = g->write_line + 3;
                  }
                  if (((pSVar7->field_0x178 & 0x78) != 8) &&
                     (pvVar22 = set_add_fn(local_570,t,&trans_scanner_block_fns), t == pvVar22)) {
                    uVar37 = (pSVar7->scanner).states.n;
                    if (((0xfe < uVar37) || (iVar40 = 1, 0xfe < (pSVar7->scanner).transitions.n)) &&
                       ((0x7e7f < uVar37 || (iVar40 = 2, 0x7e7f < (pSVar7->scanner).transitions.n)))
                       ) {
                      iVar40 = 4;
                    }
                    pcVar49 = "unsigned char";
                    if (iVar40 != 1) {
                      if (iVar40 == 4) {
                        pcVar49 = "unsigned int";
                      }
                      else if (iVar40 == 2) {
                        pcVar49 = "unsigned short";
                      }
                      else {
                        d_fail("bad case");
                        pcVar49 = "";
                      }
                    }
                    pcVar23 = make_name("d_accepts_diff_%d_%d_%d_%s",uVar50,uVar48 & 0xffffffff,
                                        (ulong)uVar41,tag);
                    start_array_fn(file,iVar40,"",pcVar49,pcVar23,"SCANNER_BLOCK_SIZE",0x40,"\n");
                    iVar51 = g->scanner_block_size;
                    if (0 < iVar51) {
                      uVar37 = 0;
                      do {
                        pcVar44 = unsigned_char_copy;
                        if (iVar40 != 1) {
                          if (iVar40 == 4) {
                            pcVar44 = unsigned_int_copy;
                          }
                          else if (iVar40 == 2) {
                            pcVar44 = unsigned_short_copy;
                          }
                          else {
                            d_fail("bad case");
                            pcVar44 = (CopyFuncType)0x0;
                          }
                        }
                        add_array_member_fn(file,pcVar44,
                                            (char *)(ulong)(pSVar7->scanner).states.v[uVar48]->
                                                           transition[iVar51 * uVar41 + uVar37]->
                                                           index,
                                            (uint)(uVar37 == g->scanner_block_size),(int)pcVar23);
                        if ((~uVar37 & 0xf) == 0) {
                          if (file->binary == 0) {
                            myfprintf(file->fp,"%s","\n");
                          }
                          g->write_line = g->write_line + 1;
                        }
                        uVar37 = uVar37 + 1;
                        iVar51 = g->scanner_block_size;
                      } while ((int)uVar37 < iVar51);
                    }
                    end_array(file,"\n\n");
                    g->write_line = g->write_line + 3;
                  }
                  uVar41 = uVar41 + 1;
                } while ((int)uVar41 < g->scanner_blocks);
              }
              if (((pSVar7->scanner).states.v[uVar48]->accepts).n != 0) {
                snprintf(speculative_code,0xff,"d_shift_%d_%d_%s",uVar50,uVar48 & 0xffffffff,tag);
                pSVar32 = (pSVar7->scanner).states.v[uVar48];
                uVar41 = (pSVar32->accepts).n;
                uVar53 = (ulong)uVar41;
                if (uVar41 != 0) {
                  uVar39 = 0;
                  do {
                    pAVar9 = (pSVar32->accepts).v[uVar39];
                    if ((int)uVar53 == 1) {
                      if (pAVar9->temp_string == (char *)0x0) {
                        pcVar49 = dup_str(speculative_code,(char *)0x0);
                        pAVar9->temp_string = pcVar49;
                        pAVar24 = (Action *)set_add_fn(&shift_hash,pAVar9,&shift_fns);
                        if (pAVar24 == pAVar9) goto LAB_00135806;
                      }
                    }
                    else {
LAB_00135806:
                      if (uVar39 == 0) {
                        pcVar49 = make_name(speculative_code);
                        start_array_fn(file,8,"","D_Shift *",pcVar49,"",0,"");
                      }
                      if (pAVar9->kind == ACTION_SHIFT_TRAILING) {
                        pcVar49 = "d_tshift_%d_%s";
                      }
                      else {
                        pcVar49 = "d_shift_%d_%s";
                      }
                      pOVar34 = get_offset(file,pcVar49,(ulong)pAVar9->term->index);
                      add_array_ptr_member_fn(file,pOVar34,"&%s%s",0);
                      if (uVar39 == ((pSVar7->scanner).states.v[uVar48]->accepts).n - 1) {
                        add_array_ptr_member_fn(file,&null_entry,"&%s%s",1);
                        end_array(file,"\n\n");
                      }
                      if (uVar39 == ((pSVar7->scanner).states.v[uVar48]->accepts).n - 1) {
                        g->write_line = g->write_line + 2;
                      }
                    }
                    uVar39 = uVar39 + 1;
                    pSVar32 = (pSVar7->scanner).states.v[uVar48];
                    uVar53 = (ulong)(pSVar32->accepts).n;
                  } while (uVar39 < uVar53);
                }
              }
            }
            uVar48 = uVar48 + 1;
          } while (uVar48 < (pSVar7->scanner).states.n);
        }
      }
      uVar50 = uVar50 + 1;
    } while (uVar50 < (g->states).n);
  }
  if ((g->states).n != 0) {
    uVar50 = 0;
    do {
      pSVar7 = (g->states).v[uVar50];
      if (((pSVar7->scanner).states.n != 0) && (pSVar7->same_shifts == (State *)0x0)) {
        pcVar49 = scanner_u_type(pSVar7);
        pcVar23 = make_name("d_scanner_%d_%s",uVar50 & 0xffffffff,tag);
        start_array_fn(file,0x28,"SB_",pcVar49,pcVar23,"",(pSVar7->scanner).states.n,"\n");
        g->write_line = g->write_line + 1;
        uVar36 = (pSVar7->scanner).states.n;
        if (((0xfe < uVar36) || (local_5a0 = pass_code, 0xfe < (pSVar7->scanner).transitions.n)) &&
           ((0x7e7f < uVar36 ||
            (local_5a0 = pass_code + 0x28, 0x7e7f < (pSVar7->scanner).transitions.n)))) {
          local_5a0 = pass_code + 0x78;
        }
        if (uVar36 != 0) {
          uVar48 = 0;
          do {
            start_struct_in_array(file);
            pSVar32 = (pSVar7->scanner).states.v[uVar48];
            uVar19 = (pSVar32->accepts).n;
            if (uVar19 == 0) {
              if (file != (File *)0x0) {
                ppvVar43 = (void **)(file->tables).cur;
                if (ppvVar43 == (void **)0x0) {
                  ppvVar43 = (void **)0x0;
                }
                pOVar34 = &null_entry;
LAB_00135b1f:
                add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
              }
            }
            else if (uVar19 == 1) {
              pvVar22 = set_add_fn(&shift_hash,*(pSVar32->accepts).v,&shift_fns);
              if (file != (File *)0x0) {
                ppvVar43 = (void **)(file->tables).cur;
                pOVar34 = get_offset(file,"%s",*(undefined8 *)((long)pvVar22 + 0x28));
                if (ppvVar43 == (void **)0x0) {
                  ppvVar43 = (void **)0x0;
                }
                add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
              }
            }
            else if (file != (File *)0x0) {
              ppvVar43 = (void **)(file->tables).cur;
              pOVar34 = get_offset(file,"d_shift_%d_%d_%s",uVar50,uVar48 & 0xffffffff,tag);
              if (ppvVar43 == (void **)0x0) {
                ppvVar43 = (void **)0x0;
              }
              goto LAB_00135b1f;
            }
            if (file->binary == 0) {
              myfprintf(file->fp,"%s",", {");
              file->first_member = 1;
            }
            if (0 < g->scanner_blocks) {
              lVar31 = 8;
              uVar53 = 0;
              do {
                speculative_code._0_4_ = pSVar7->index;
                speculative_code._8_4_ = (undefined4)uVar53;
                ppSVar10 = (pSVar7->scanner).states.v;
                lVar52 = (long)(int)speculative_code._8_4_ * (long)g->scanner_block_size;
                speculative_code._16_8_ = ppSVar10[uVar48]->chars + lVar52;
                speculative_code._24_8_ = ppSVar10[uVar48]->transition + lVar52;
                speculative_code._4_4_ = (int)uVar48;
                puVar25 = (uint *)set_add_fn(local_5a0,speculative_code,&scanner_block_fns);
                if (puVar25 == (uint *)speculative_code) {
                  __assert_fail("yv != xv",
                                "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                                ,0x321,"void write_scanner_data(File *, Grammar *, char *)");
                }
                if (file != (File *)0x0) {
                  pcVar49 = (file->tables).cur;
                  if (pcVar49 == (char *)0x0) {
                    pOVar34 = get_offset(file,"d_scanner_%d_%d_%d_%s",(ulong)*puVar25,
                                         (ulong)puVar25[1],(ulong)puVar25[2],tag);
                    ppvVar43 = (void **)0x0;
                  }
                  else {
                    ppvVar43 = (void **)(pcVar49 + lVar31);
                    pOVar34 = get_offset(file,"d_scanner_%d_%d_%d_%s",(ulong)*puVar25,
                                         (ulong)puVar25[1],(ulong)puVar25[2],tag);
                  }
                  add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
                }
                if (((uVar53 & 1) != 0) && (uVar53 != g->scanner_blocks - 1)) {
                  if (file->binary == 0) {
                    myfprintf(file->fp,"%s","\n ");
                  }
                  g->write_line = g->write_line + 1;
                }
                uVar53 = uVar53 + 1;
                lVar31 = lVar31 + 8;
              } while ((long)uVar53 < (long)g->scanner_blocks);
            }
            if (file->binary == 0) {
              myfprintf(file->fp,"%s","}");
            }
            if (file->binary == 0) {
              pcVar49 = ",\n";
              if (uVar48 == (pSVar7->scanner).states.n - 1) {
                pcVar49 = "\n";
              }
              myfprintf(file->fp,"}%s",pcVar49);
            }
            else {
              ppcVar45 = &(file->tables).cur;
              *ppcVar45 = *ppcVar45 + file->elem_size;
            }
            g->write_line = g->write_line + 1;
            uVar48 = uVar48 + 1;
          } while (uVar48 < (pSVar7->scanner).states.n);
        }
        end_array(file,"\n\n");
        g->write_line = g->write_line + 2;
        if ((pSVar7->field_0x178 & 0x78) != 8) {
          pcVar49 = scanner_u_type(pSVar7);
          pcVar23 = make_name("d_transition_%d_%s",uVar50 & 0xffffffff,tag);
          start_array_fn(file,0x20,"SB_trans_",pcVar49,pcVar23,"",(pSVar7->scanner).states.n,"\n");
          g->write_line = g->write_line + 1;
          uVar36 = (pSVar7->scanner).states.n;
          if (((0xfe < uVar36) || (local_5a0 = fname, 0xfe < (pSVar7->scanner).transitions.n)) &&
             ((0x7e7f < uVar36 ||
              (local_5a0 = fname + 0x28, 0x7e7f < (pSVar7->scanner).transitions.n)))) {
            local_5a0 = fname + 0x78;
          }
          if (uVar36 != 0) {
            uVar48 = 0;
            do {
              start_struct_in_array(file);
              if (file->binary == 0) {
                myfprintf(file->fp,"%s","{");
              }
              if (0 < g->scanner_blocks) {
                lVar31 = 0;
                uVar53 = 0;
                do {
                  speculative_code._0_4_ = pSVar7->index;
                  speculative_code._4_4_ = (undefined4)uVar48;
                  speculative_code._8_4_ = (undefined4)uVar53;
                  ppSVar10 = (pSVar7->scanner).states.v;
                  lVar52 = (long)(int)speculative_code._8_4_ * (long)g->scanner_block_size;
                  speculative_code._16_8_ = ppSVar10[uVar48]->chars + lVar52;
                  speculative_code._24_8_ = ppSVar10[uVar48]->transition + lVar52;
                  puVar25 = (uint *)set_add_fn(local_5a0,speculative_code,&trans_scanner_block_fns);
                  if (puVar25 == (uint *)speculative_code) {
                    __assert_fail("yv != xv",
                                  "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                                  ,0x345,"void write_scanner_data(File *, Grammar *, char *)");
                  }
                  pcVar49 = (file->tables).cur;
                  if (pcVar49 == (char *)0x0) {
                    pOVar34 = get_offset(file,"d_accepts_diff_%d_%d_%d_%s",(ulong)*puVar25,
                                         (ulong)puVar25[1],(ulong)puVar25[2],tag);
                    ppvVar43 = (void **)0x0;
                  }
                  else {
                    ppvVar43 = (void **)(pcVar49 + lVar31);
                    pOVar34 = get_offset(file,"d_accepts_diff_%d_%d_%d_%s",(ulong)*puVar25,
                                         (ulong)puVar25[1],(ulong)puVar25[2],tag);
                  }
                  add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
                  if (((uVar53 & 1) != 0) && (uVar53 != g->scanner_blocks - 1)) {
                    if (file->binary == 0) {
                      myfprintf(file->fp,"%s","\n ");
                    }
                    g->write_line = g->write_line + 1;
                  }
                  uVar53 = uVar53 + 1;
                  lVar31 = lVar31 + 8;
                } while ((long)uVar53 < (long)g->scanner_blocks);
              }
              if (file->binary == 0) {
                myfprintf(file->fp,"%s","}");
              }
              if (file->binary == 0) {
                pcVar49 = ",\n";
                if (uVar48 == (pSVar7->scanner).states.n - 1) {
                  pcVar49 = "\n";
                }
                myfprintf(file->fp,"}%s",pcVar49);
              }
              else {
                ppcVar45 = &(file->tables).cur;
                *ppcVar45 = *ppcVar45 + file->elem_size;
              }
              g->write_line = g->write_line + 1;
              uVar48 = uVar48 + 1;
            } while (uVar48 < (pSVar7->scanner).states.n);
          }
          end_array(file,"\n\n");
          g->write_line = g->write_line + 2;
        }
      }
      uVar50 = uVar50 + 1;
    } while (uVar50 < (g->states).n);
  }
  pcVar49 = fname + 0x10;
  lVar31 = 4;
  pcVar23 = pass_code + 0x10;
  do {
    pcVar28 = *(char **)(pcVar23 + -8);
    if (pcVar23 != pcVar28 && pcVar28 != (char *)0x0) {
      free(pcVar28);
    }
    pcVar23[-0x10] = '\0';
    pcVar23[-0xf] = '\0';
    pcVar23[-0xe] = '\0';
    pcVar23[-0xd] = '\0';
    pcVar23[-8] = '\0';
    pcVar23[-7] = '\0';
    pcVar23[-6] = '\0';
    pcVar23[-5] = '\0';
    pcVar23[-4] = '\0';
    pcVar23[-3] = '\0';
    pcVar23[-2] = '\0';
    pcVar23[-1] = '\0';
    pcVar28 = *(char **)(pcVar49 + -8);
    if (pcVar49 != pcVar28 && pcVar28 != (char *)0x0) {
      free(pcVar28);
    }
    pcVar49[-0x10] = '\0';
    pcVar49[-0xf] = '\0';
    pcVar49[-0xe] = '\0';
    pcVar49[-0xd] = '\0';
    pcVar49[-8] = '\0';
    pcVar49[-7] = '\0';
    pcVar49[-6] = '\0';
    pcVar49[-5] = '\0';
    pcVar49[-4] = '\0';
    pcVar49[-3] = '\0';
    pcVar49[-2] = '\0';
    pcVar49[-1] = '\0';
    pcVar49 = pcVar49 + 0x28;
    pcVar23 = pcVar23 + 0x28;
    lVar31 = lVar31 + -1;
  } while (lVar31 != 0);
  if (shift_hash.v != shift_hash.e && shift_hash.v != (Action **)0x0) {
    free(shift_hash.v);
  }
  shift_hash.n = 0;
  shift_hash.v = (Action **)0x0;
  free(pvVar21);
  if ((file->binary == 0) && ((g->states).n != 0)) {
    pFVar29 = (FILE *)file->fp;
    uVar50 = 0;
    do {
      pSVar7 = (g->states).v[uVar50];
      if ((pSVar7->shift_actions).n != 0) {
        uVar48 = 0;
        do {
          pAVar9 = (pSVar7->shift_actions).v[uVar48];
          if ((pAVar9->kind == ACTION_SHIFT) && (pAVar9->term->kind == TERM_CODE)) {
            if ((pSVar7->field_0x178 & 2) == 0) {
              pSVar7->field_0x178 = pSVar7->field_0x178 | 2;
              pcVar49 = make_name("d_scan_code_%d_%s",uVar50 & 0xffffffff,tag);
              new_offset(file,pcVar49);
              myfprintf((FILE *)pFVar29,
                        "int d_scan_code_%d_%s(d_loc_t *loc,unsigned short *symbol, int *term_priority,unsigned char *op_assoc, int *op_priority) {\n  int res;\n"
                        ,uVar50 & 0xffffffff,tag);
              g->write_line = g->write_line + 1;
            }
            myfprintf((FILE *)pFVar29,"  if ((res = ");
            pcVar49 = pAVar9->term->string;
            sVar26 = strlen(pcVar49);
            uVar53 = (ulong)((int)sVar26 - 1);
            if (pcVar49[uVar53] == ')') {
              fwrite(pcVar49,uVar53,1,pFVar29);
              myfprintf((FILE *)pFVar29,", ");
            }
            else {
              myfprintf((FILE *)pFVar29,"%s(",pcVar49);
            }
            myfprintf((FILE *)pFVar29,
                      "loc, op_assoc, op_priority))) {\n    *symbol = %d;\n    *term_priority = %d;\n    return res;\n  }\n"
                      ,(ulong)((g->productions).n + pAVar9->term->index),
                      (ulong)(uint)pAVar9->term->term_priority);
            g->write_line = g->write_line + 1;
          }
          uVar48 = uVar48 + 1;
        } while (uVar48 < (pSVar7->shift_actions).n);
      }
      if ((pSVar7->field_0x178 & 2) != 0) {
        myfprintf((FILE *)pFVar29,"  return 0;\n}\n\n");
        g->write_line = g->write_line + 3;
      }
      uVar50 = uVar50 + 1;
    } while (uVar50 < (g->states).n);
  }
  uVar36 = (g->productions).n + (g->terminals).n + 7;
  uVar47 = uVar36 >> 3;
  uVar50 = (ulong)uVar47;
  pvVar21 = malloc(uVar50);
  final_code[0] = '\0';
  final_code[1] = '\0';
  final_code[2] = '\0';
  final_code[3] = '\0';
  final_code[8] = '\0';
  final_code[9] = '\0';
  final_code[10] = '\0';
  final_code[0xb] = '\0';
  final_code[0xc] = '\0';
  final_code[0xd] = '\0';
  final_code[0xe] = '\0';
  final_code[0xf] = '\0';
  if ((g->states).n != 0) {
    uVar48 = 1;
    if (1 < uVar47) {
      uVar48 = uVar50;
    }
    uVar53 = 0;
LAB_00136358:
    pSVar7 = (g->states).v[uVar53];
    if ((pSVar7->gotos).n != 0) {
      uVar39 = 0;
      do {
        pEVar11 = (pSVar7->gotos).v[uVar39]->elem;
        if ((pEVar11->kind == ELEM_TERM) && (((pEVar11->e).term)->kind == TERM_TOKEN)) {
          pSVar7->field_0x178 = pSVar7->field_0x178 | 4;
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 < (pSVar7->gotos).n);
      memset(pvVar21,0,uVar50);
      uVar41 = elem_symbol(g,(*(pSVar7->gotos).v)->elem);
      pbVar1 = (byte *)((long)pvVar21 + (ulong)(uVar41 >> 3));
      *pbVar1 = *pbVar1 | (byte)(1 << ((byte)uVar41 & 7));
      if (1 < (pSVar7->gotos).n) {
        uVar39 = 1;
        do {
          uVar19 = elem_symbol(g,(pSVar7->gotos).v[uVar39]->elem);
          pbVar1 = (byte *)((long)pvVar21 + (ulong)(uVar19 >> 3));
          *pbVar1 = *pbVar1 | (byte)(1 << ((byte)uVar19 & 7));
          if (uVar19 < uVar41) {
            uVar41 = uVar19;
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 < (pSVar7->gotos).n);
      }
LAB_00136426:
      bVar15 = true;
      if (0 < (int)(pSVar7->gotos).n) {
        lVar52 = 1;
        lVar31 = 0;
LAB_0013643b:
        uVar19 = elem_symbol(g,(pSVar7->gotos).v[lVar31]->elem);
        uVar37 = uVar19 - uVar41;
        while ((uint)final_code._0_4_ <= uVar37) {
          if (final_code._8_8_ == 0) {
            pcVar49 = final_code + (ulong)(uint)final_code._0_4_ * 8 + 0x10;
            pcVar49[0] = '\0';
            pcVar49[1] = '\0';
            pcVar49[2] = '\0';
            pcVar49[3] = '\0';
            pcVar49[4] = '\0';
            pcVar49[5] = '\0';
            pcVar49[6] = '\0';
            pcVar49[7] = '\0';
            final_code._0_4_ = final_code._0_4_ + 1;
            final_code._8_8_ = final_code + 0x10;
          }
          else if ((char *)final_code._8_8_ == final_code + 0x10) {
            if (2 < (uint)final_code._0_4_) goto LAB_001364b5;
LAB_00136478:
            *(undefined8 *)(final_code._8_8_ + (ulong)(uint)final_code._0_4_ * 8) = 0;
            final_code._0_4_ = final_code._0_4_ + 1;
          }
          else {
            if ((final_code._0_4_ & 7) != 0) goto LAB_00136478;
LAB_001364b5:
            vec_add_internal(final_code,(void *)0x0);
          }
        }
        if (*(long *)(final_code._8_8_ + (ulong)uVar37 * 8) == 0) goto code_r0x001364d8;
        if (lVar31 != 0) {
          do {
            uVar19 = elem_symbol(g,(pSVar7->gotos).v[(int)lVar52 - 2]->elem);
            *(undefined8 *)(final_code._8_8_ + (ulong)(uVar19 - uVar41) * 8) = 0;
            lVar52 = lVar52 + -1;
          } while (1 < lVar52);
        }
        uVar41 = uVar41 - 1;
        bVar15 = false;
      }
      goto LAB_0013654b;
    }
    pSVar7->goto_table_offset = -0x7fffffff;
    goto LAB_0013667f;
  }
LAB_001369a8:
  uVar17 = final_code._0_4_;
  pcVar49 = make_name("d_gotos_%s",tag);
  if (uVar17 == 0) {
    start_array_fn(file,2,"","unsigned short",pcVar49,"",1,"");
    if (file->binary == 0) {
      myfprintf(file->fp,"%d%s",0,"");
    }
    else {
      file->n_elems = file->n_elems + 1;
      make_room_in_buf(&file->tables,(long)file->elem_size);
      pcVar49 = (file->tables).cur;
      pcVar49[0] = '\0';
      pcVar49[1] = '\0';
      (file->tables).cur = pcVar49 + file->elem_size;
    }
    end_array(file,"\n");
    iVar40 = 1;
  }
  else {
    start_array_fn(file,2,"","unsigned short",pcVar49,"",final_code._0_4_,"\n");
    g->write_line = g->write_line + 1;
    if (final_code._0_4_ != 0) {
      uVar50 = 0;
      do {
        if (0xffff < *(ulong *)(final_code._8_8_ + uVar50 * 8)) {
          d_fail("goto table overflow");
        }
        if (file->binary == 0) {
          pcVar49 = ",";
          if (uVar50 == final_code._0_4_ - 1) {
            pcVar49 = "";
          }
          myfprintf(file->fp,"%d%s",*(undefined8 *)(final_code._8_8_ + uVar50 * 8),pcVar49);
        }
        else {
          file->n_elems = file->n_elems + 1;
          make_room_in_buf(&file->tables,(long)file->elem_size);
          pcVar49 = (file->tables).cur;
          *(undefined2 *)pcVar49 = *(undefined2 *)(final_code._8_8_ + uVar50 * 8);
          (file->tables).cur = pcVar49 + file->elem_size;
        }
        if ((~(uint)uVar50 & 0xf) == 0) {
          if (file->binary == 0) {
            myfprintf(file->fp,"%s","\n");
          }
          g->write_line = g->write_line + 1;
        }
        uVar50 = uVar50 + 1;
      } while (uVar50 < (uint)final_code._0_4_);
    }
    end_array(file,"\n\n");
    iVar40 = 2;
  }
  g->write_line = g->write_line + iVar40;
  if ((char *)final_code._8_8_ != final_code + 0x10 && final_code._8_8_ != 0) {
    free((void *)final_code._8_8_);
  }
  final_code[0] = '\0';
  final_code[1] = '\0';
  final_code[2] = '\0';
  final_code[3] = '\0';
  final_code[8] = '\0';
  final_code[9] = '\0';
  final_code[10] = '\0';
  final_code[0xb] = '\0';
  final_code[0xc] = '\0';
  final_code[0xd] = '\0';
  final_code[0xe] = '\0';
  final_code[0xf] = '\0';
  free(pvVar21);
  if ((g->states).n != 0) {
    uVar50 = 0;
    do {
      pSVar7 = (g->states).v[uVar50];
      if (((pSVar7->error_recovery_hints).n != 0) &&
         (pSVar27 = (State *)set_add_fn(&er_hash,pSVar7,&er_hint_hash_fns), pSVar27 == pSVar7)) {
        pcVar49 = make_name("d_error_recovery_hints_%d_%s",uVar50 & 0xffffffff,tag);
        start_array_fn(file,0x10,"","D_ErrorRecoveryHint",pcVar49,"",0,"");
        if (file->binary == 0) {
          pcVar49 = "";
          if (1 < (pSVar7->error_recovery_hints).n) {
            pcVar49 = "\n";
          }
          myfprintf(file->fp,"%s",pcVar49);
        }
        if ((pSVar7->error_recovery_hints).n != 0) {
          uVar48 = 0;
          do {
            pRVar42 = (pSVar7->error_recovery_hints).v[uVar48]->rule;
            pcVar49 = escape_string((((pRVar42->elems).v[(pRVar42->elems).n - 1]->e).term)->string);
            start_struct_in_array(file);
            if (file->binary == 0) {
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              myfprintf(file->fp,"%d",(ulong)(pSVar7->error_recovery_hints).v[uVar48]->depth);
            }
            else {
              *(short *)(file->tables).cur = (short)(pSVar7->error_recovery_hints).v[uVar48]->depth;
            }
            if (file->binary == 0) {
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              myfprintf(file->fp,"%d",
                        (ulong)(pSVar7->error_recovery_hints).v[uVar48]->rule->prod->index);
            }
            else {
              *(short *)((file->tables).cur + 2) =
                   (short)(pSVar7->error_recovery_hints).v[uVar48]->rule->prod->index;
            }
            pcVar23 = (file->tables).cur;
            if (pcVar23 == (char *)0x0) {
              ppcVar45 = (char **)0x0;
            }
            else {
              ppcVar45 = (char **)(pcVar23 + 8);
            }
            add_struct_str_member_fn(file,ppcVar45,pcVar49);
            if (file->binary == 0) {
              pcVar23 = ",\n";
              if (uVar48 == (pSVar7->error_recovery_hints).n - 1) {
                pcVar23 = "";
              }
              myfprintf(file->fp,"}%s",pcVar23);
            }
            else {
              ppcVar45 = &(file->tables).cur;
              *ppcVar45 = *ppcVar45 + file->elem_size;
            }
            if (uVar48 != (pSVar7->error_recovery_hints).n - 1) {
              g->write_line = g->write_line + 1;
            }
            free(pcVar49);
            uVar48 = uVar48 + 1;
          } while (uVar48 < (pSVar7->error_recovery_hints).n);
        }
        end_array(file,"\n");
        g->write_line = g->write_line + 1;
      }
      uVar50 = uVar50 + 1;
    } while (uVar50 < (g->states).n);
  }
  if (file->binary == 0) {
    myfprintf(file->fp,"%s","\n");
  }
  pcVar49 = make_name("d_states_%s",tag);
  start_array_fn(file,0x78,"","D_State",pcVar49,"",0,"");
  if ((g->states).n == 0) {
    if (file->binary == 0) {
      myfprintf(file->fp,"{{0, {0, NULL}, 0, NULL}};\n\n");
    }
    else {
      d_fail("no states\n");
    }
  }
  else {
    if (file->binary == 0) {
      myfprintf(file->fp,"%s","\n");
    }
    if ((g->states).n != 0) {
      uVar50 = 0;
      do {
        pSVar7 = (g->states).v[uVar50];
        pSVar27 = pSVar7->same_shifts;
        if (pSVar7->same_shifts == (State *)0x0) {
          pSVar27 = pSVar7;
        }
        start_struct_in_array(file);
        if ((pSVar7->gotos).n == 0) {
          if (file != (File *)0x0) {
            ppvVar43 = (void **)(file->tables).cur;
            if (ppvVar43 == (void **)0x0) {
              ppvVar43 = (void **)0x0;
            }
            pOVar34 = &null_entry;
            goto LAB_00136fc7;
          }
        }
        else if (file != (File *)0x0) {
          ppvVar43 = (void **)(file->tables).cur;
          pOVar34 = get_offset(file,"d_goto_valid_%d_%s",uVar50 & 0xffffffff,tag);
          if (ppvVar43 == (void **)0x0) {
            ppvVar43 = (void **)0x0;
          }
LAB_00136fc7:
          add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
        }
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)(uint)pSVar7->goto_table_offset);
        }
        else {
          *(int *)((file->tables).cur + 8) = pSVar7->goto_table_offset;
        }
        if (file->binary == 0) {
          myfprintf(file->fp,"%s",", {");
          file->first_member = 1;
        }
        uVar19 = (pSVar7->reduce_actions).n;
        if (uVar19 == 0) {
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            myfprintf(file->fp,"%d",0);
          }
          else {
            pcVar49 = (file->tables).cur;
            pcVar49[0x10] = '\0';
            pcVar49[0x11] = '\0';
            pcVar49[0x12] = '\0';
            pcVar49[0x13] = '\0';
          }
          pcVar49 = (file->tables).cur;
          if (pcVar49 == (char *)0x0) {
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x18);
          }
          pOVar34 = &null_entry;
        }
        else {
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            myfprintf(file->fp,"%d",(ulong)(pSVar7->reduce_actions).n);
          }
          else {
            *(uint *)((file->tables).cur + 0x10) = uVar19;
          }
          pcVar49 = (file->tables).cur;
          if (pcVar49 == (char *)0x0) {
            pOVar34 = get_offset(file,"d_reductions_%d_%s",uVar50 & 0xffffffff,tag);
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x18);
            pOVar34 = get_offset(file,"d_reductions_%d_%s",uVar50 & 0xffffffff,tag);
          }
        }
        add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
        if (file->binary == 0) {
          myfprintf(file->fp,"%s","}, ");
        }
        if (file->binary == 0) {
          myfprintf(file->fp,"%s","{");
          file->first_member = 1;
        }
        uVar19 = (pSVar7->right_epsilon_hints).n;
        if (uVar19 == 0) {
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            myfprintf(file->fp,"%d",0);
          }
          else {
            pcVar49 = (file->tables).cur;
            pcVar49[0x20] = '\0';
            pcVar49[0x21] = '\0';
            pcVar49[0x22] = '\0';
            pcVar49[0x23] = '\0';
          }
          pcVar49 = (file->tables).cur;
          if (pcVar49 == (char *)0x0) {
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x28);
          }
          pOVar34 = &null_entry;
        }
        else {
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            myfprintf(file->fp,"%d",(ulong)(pSVar7->right_epsilon_hints).n);
          }
          else {
            *(uint *)((file->tables).cur + 0x20) = uVar19;
          }
          pcVar49 = (file->tables).cur;
          if (pcVar49 == (char *)0x0) {
            pOVar34 = get_offset(file,"d_right_epsilon_hints_%d_%s",uVar50 & 0xffffffff,tag);
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x28);
            pOVar34 = get_offset(file,"d_right_epsilon_hints_%d_%s",uVar50 & 0xffffffff,tag);
          }
        }
        add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
        if (file->binary == 0) {
          myfprintf(file->fp,"%s","}, ");
        }
        if (file->binary == 0) {
          myfprintf(file->fp,"%s","{");
          file->first_member = 1;
        }
        if ((pSVar7->error_recovery_hints).n == 0) {
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            myfprintf(file->fp,"%d",0);
          }
          else {
            pcVar49 = (file->tables).cur;
            pcVar49[0x30] = '\0';
            pcVar49[0x31] = '\0';
            pcVar49[0x32] = '\0';
            pcVar49[0x33] = '\0';
          }
          pcVar49 = (file->tables).cur;
          if (pcVar49 == (char *)0x0) {
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x38);
          }
          add_struct_ptr_member_fn(file,ppvVar43,&null_entry,"%s");
        }
        else {
          puVar25 = (uint *)set_add_fn(&er_hash,pSVar7,&er_hint_hash_fns);
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            myfprintf(file->fp,"%d",(ulong)(pSVar7->error_recovery_hints).n);
          }
          else {
            *(uint *)((file->tables).cur + 0x30) = (pSVar7->error_recovery_hints).n;
          }
          pcVar49 = (file->tables).cur;
          if (pcVar49 == (char *)0x0) {
            pOVar34 = get_offset(file,"d_error_recovery_hints_%d_%s",(ulong)*puVar25,tag);
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x38);
            pOVar34 = get_offset(file,"d_error_recovery_hints_%d_%s",(ulong)*puVar25,tag);
          }
          add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
        }
        if (file->binary == 0) {
          myfprintf(file->fp,"%s","}");
        }
        if ((((pSVar7->shift_actions).n == 0) && ((pSVar7->field_0x178 & 2) == 0)) &&
           (((pSVar7->field_0x178 & 4) == 0 || ((g->scanner).code == (char *)0x0)))) {
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            pFVar46 = file->fp;
            uVar35 = 0;
LAB_0013754e:
            myfprintf(pFVar46,"%d",uVar35);
          }
          else {
            pcVar49 = (file->tables).cur;
            pcVar49[0x40] = '\0';
            pcVar49[0x41] = '\0';
            pcVar49[0x42] = '\0';
            pcVar49[0x43] = '\0';
          }
        }
        else {
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            pFVar46 = file->fp;
            uVar35 = 1;
            goto LAB_0013754e;
          }
          pcVar49 = (file->tables).cur;
          pcVar49[0x40] = '\x01';
          pcVar49[0x41] = '\0';
          pcVar49[0x42] = '\0';
          pcVar49[0x43] = '\0';
        }
        if ((g->scanner).code == (char *)0x0) {
          pcVar49 = (file->tables).cur;
          if ((pSVar7->field_0x178 & 2) == 0) {
            if (pcVar49 == (char *)0x0) {
              ppvVar43 = (void **)0x0;
            }
            else {
              ppvVar43 = (void **)(pcVar49 + 0x48);
            }
            goto LAB_00137624;
          }
          if (pcVar49 == (char *)0x0) {
            pOVar34 = get_offset(file,"d_scan_code_%d_%s",uVar50 & 0xffffffff,tag);
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x48);
            pOVar34 = get_offset(file,"d_scan_code_%d_%s",uVar50 & 0xffffffff,tag);
          }
          add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
        }
        else if ((pSVar7->field_0x178 & 4) == 0) {
          pcVar49 = (file->tables).cur;
          if (pcVar49 == (char *)0x0) {
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x48);
          }
LAB_00137624:
          add_struct_ptr_member_fn(file,ppvVar43,&null_entry,"%s");
        }
        else {
          if (file->binary != 0) {
            __assert_fail("!fp->binary",
                          "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                          ,0x5dd,"void write_state_data(File *, Grammar *, VecState *, char *)");
          }
          myfprintf(file->fp,", %s");
        }
        if ((pSVar7->scanner).states.n == 0) {
          pcVar49 = (file->tables).cur;
          if (pcVar49 == (char *)0x0) {
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x50);
          }
          pOVar34 = &null_entry;
        }
        else {
          if (file->binary == 0) {
            myfprintf(file->fp,"%s",", (void*)");
            file->first_member = 1;
          }
          pcVar49 = (file->tables).cur;
          if (pcVar49 == (char *)0x0) {
            pOVar34 = get_offset(file,"d_scanner_%d_%s",(ulong)pSVar27->index,tag);
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x50);
            pOVar34 = get_offset(file,"d_scanner_%d_%s",(ulong)pSVar27->index,tag);
          }
        }
        add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
        if (file->binary == 0) {
          uVar36 = (pSVar7->scanner).states.n;
          if (((0xfe < uVar36) || (iVar40 = 1, 0xfe < (pSVar7->scanner).transitions.n)) &&
             ((0x7e7f < uVar36 || (iVar40 = 2, 0x7e7f < (pSVar7->scanner).transitions.n)))) {
            iVar40 = 4;
          }
          pFVar46 = file->fp;
          pcVar49 = "unsigned char";
          if (iVar40 != 1) {
            if (iVar40 == 4) {
              pcVar49 = "unsigned int";
            }
            else if (iVar40 == 2) {
              pcVar49 = "unsigned short";
            }
            else {
              d_fail("bad case");
              pcVar49 = "";
            }
          }
          myfprintf(pFVar46,", sizeof(%s) ",pcVar49);
        }
        else {
          uVar36 = (pSVar7->scanner).states.n;
          if (((0xfe < uVar36) || (cVar18 = '\x01', 0xfe < (pSVar7->scanner).transitions.n)) &&
             ((0x7e7f < uVar36 || (cVar18 = '\x02', 0x7e7f < (pSVar7->scanner).transitions.n)))) {
            cVar18 = '\x04';
          }
          (file->tables).cur[0x58] = cVar18;
        }
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)((byte)pSVar7->field_0x178 & 1));
        }
        else {
          (file->tables).cur[0x59] = pSVar7->field_0x178 & 1;
        }
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,*(char **)((long)scan_kind_strings +
                                       (ulong)((byte)pSVar7->field_0x178 & 0x38)));
        }
        else {
          (file->tables).cur[0x5a] = (byte)pSVar7->field_0x178 >> 3 & 7;
        }
        if (((pSVar27->field_0x178 & 0x78) == 8) || ((pSVar27->scanner).states.n == 0)) {
          pcVar49 = (file->tables).cur;
          if (pcVar49 == (char *)0x0) {
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x60);
          }
          pOVar34 = &null_entry;
        }
        else {
          if (file->binary == 0) {
            myfprintf(file->fp,"%s",", (void*)");
            file->first_member = 1;
          }
          pcVar49 = (file->tables).cur;
          if (pcVar49 == (char *)0x0) {
            pOVar34 = get_offset(file,"d_transition_%d_%s",(ulong)pSVar27->index,tag);
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x60);
            pOVar34 = get_offset(file,"d_transition_%d_%s",(ulong)pSVar27->index,tag);
          }
        }
        add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
        if (((pSVar27->field_0x178 & 0x78) == 8) || ((pSVar27->scanner).states.n == 0)) {
          pcVar49 = (file->tables).cur;
          if (pcVar49 == (char *)0x0) {
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x68);
          }
          add_struct_ptr_member_fn(file,ppvVar43,&null_entry,"%s");
        }
        else {
          pcVar49 = (file->tables).cur;
          if (pcVar49 == (char *)0x0) {
            pOVar34 = get_offset(file,"d_accepts_diff_%d_%s",(ulong)pSVar27->index,tag);
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar49 + 0x68);
            pOVar34 = get_offset(file,"d_accepts_diff_%d_%s",(ulong)pSVar27->index,tag);
          }
          add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
        }
        if (pSVar7->reduces_to == (State *)0x0) {
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            pFVar46 = file->fp;
            uVar48 = 0xffffffff;
            goto LAB_00137ae6;
          }
          pcVar49 = (file->tables).cur;
          pcVar49[0x70] = -1;
          pcVar49[0x71] = -1;
          pcVar49[0x72] = -1;
          pcVar49[0x73] = -1;
        }
        else if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          pFVar46 = file->fp;
          uVar48 = (ulong)pSVar7->reduces_to->index;
LAB_00137ae6:
          myfprintf(pFVar46,"%d",uVar48);
        }
        else {
          *(uint *)((file->tables).cur + 0x70) = pSVar7->reduces_to->index;
        }
        if (file->binary == 0) {
          pcVar49 = ",\n";
          if (uVar50 == (g->states).n - 1) {
            pcVar49 = "\n";
          }
          myfprintf(file->fp,"}%s",pcVar49);
        }
        else {
          ppcVar45 = &(file->tables).cur;
          *ppcVar45 = *ppcVar45 + file->elem_size;
        }
        uVar50 = uVar50 + 1;
      } while (uVar50 < (g->states).n);
    }
    end_array(file,"\n\n");
  }
  pcVar49 = make_name("d_symbols_%s",tag);
  start_array_fn(file,0x18,"","D_Symbol",pcVar49,"",0,"\n");
  g->write_line = g->write_line + 1;
  if ((g->productions).n != 0) {
    uVar50 = 0;
    do {
      pPVar20 = (g->productions).v[uVar50];
      uVar48 = 0xffffffff;
      if (((pPVar20->field_0x3c & 0x1c) == 0) && (pPVar20->elem != (Elem *)0x0)) {
        uVar48 = (ulong)pPVar20->state->index;
      }
      start_struct_in_array(file);
      bVar16 = (byte)(g->productions).v[uVar50]->field_0x3c >> 2;
      uVar36 = bVar16 & 7;
      uVar53 = (ulong)uVar36;
      if (uVar36 - 2 < 2) {
        uVar53 = 2;
      }
      else if ((bVar16 & 7) != 0) {
        uVar53 = (ulong)((char)uVar36 == '\x04') + 1;
      }
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,d_internal_rel + *(int *)(d_internal_rel + uVar53 * 4));
      }
      else {
        *(int *)(file->tables).cur = d_internal_values[uVar53];
      }
      pcVar49 = (file->tables).cur;
      if (pcVar49 == (char *)0x0) {
        pcVar49 = (g->productions).v[uVar50]->name;
        ppcVar45 = (char **)0x0;
      }
      else {
        ppcVar45 = (char **)(pcVar49 + 8);
        pcVar49 = (g->productions).v[uVar50]->name;
      }
      add_struct_str_member_fn(file,ppcVar45,pcVar49);
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",(ulong)(g->productions).v[uVar50]->name_len);
      }
      else {
        *(uint *)((file->tables).cur + 0x10) = (g->productions).v[uVar50]->name_len;
      }
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",uVar48);
      }
      else {
        *(int *)((file->tables).cur + 0x14) = (int)uVar48;
      }
      if (file->binary == 0) {
        myfprintf(file->fp,"}%s",",\n");
      }
      else {
        ppcVar45 = &(file->tables).cur;
        *ppcVar45 = *ppcVar45 + file->elem_size;
      }
      g->write_line = g->write_line + 1;
      uVar50 = uVar50 + 1;
    } while (uVar50 < (g->productions).n);
  }
  if ((g->terminals).n != 0) {
    uVar50 = 0;
    do {
      pcVar23 = escape_string((g->terminals).v[uVar50]->string);
      pcVar28 = escape_string(pcVar23);
      pTVar6 = (g->terminals).v[uVar50];
      pcVar49 = pTVar6->term_name;
      if ((pcVar49 == (char *)0x0) && (pcVar49 = pcVar23, file->binary == 0)) {
        pcVar49 = pcVar28;
      }
      lVar31 = (long)(int)pTVar6->kind;
      start_struct_in_array(file);
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,d_symbol_rel + *(int *)(d_symbol_rel + lVar31 * 4));
      }
      else {
        *(int *)(file->tables).cur = d_symbol_values[lVar31];
      }
      pcVar12 = (file->tables).cur;
      if (pcVar12 == (char *)0x0) {
        ppcVar45 = (char **)0x0;
      }
      else {
        ppcVar45 = (char **)(pcVar12 + 8);
      }
      add_struct_str_member_fn(file,ppcVar45,pcVar49);
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        pFVar46 = file->fp;
        sVar26 = strlen(pcVar49);
        myfprintf(pFVar46,"%d",sVar26 & 0xffffffff);
      }
      else {
        sVar26 = strlen(pcVar49);
        *(int *)((file->tables).cur + 0x10) = (int)sVar26;
      }
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",0xffffffff);
      }
      else {
        pcVar49 = (file->tables).cur;
        pcVar49[0x14] = -1;
        pcVar49[0x15] = -1;
        pcVar49[0x16] = -1;
        pcVar49[0x17] = -1;
      }
      if (file->binary == 0) {
        myfprintf(file->fp,"}%s",",\n");
      }
      else {
        ppcVar45 = &(file->tables).cur;
        *ppcVar45 = *ppcVar45 + file->elem_size;
      }
      g->write_line = g->write_line + 1;
      free(pcVar23);
      free(pcVar28);
      uVar50 = uVar50 + 1;
    } while (uVar50 < (g->terminals).n);
  }
  end_array(file,"\n\n");
  g->write_line = g->write_line + 2;
  if ((g->passes).n != 0) {
    pcVar49 = make_name("d_passes_%s",tag);
    start_array_fn(file,0x18,"","D_Pass",pcVar49,"",0,"");
    g->write_line = g->write_line + 1;
    if ((g->passes).n != 0) {
      uVar50 = 0;
      do {
        pDVar13 = (g->passes).v[uVar50];
        start_struct_in_array(file);
        if (file != (File *)0x0) {
          ppcVar45 = (char **)(file->tables).cur;
          if (ppcVar45 == (char **)0x0) {
            ppcVar45 = (char **)0x0;
          }
          add_struct_str_member_fn(file,ppcVar45,pDVar13->name);
        }
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)pDVar13->name_len);
        }
        else {
          *(uint *)((file->tables).cur + 8) = pDVar13->name_len;
        }
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"0x%x",(ulong)pDVar13->kind);
        }
        else {
          *(uint *)((file->tables).cur + 0xc) = pDVar13->kind;
        }
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)pDVar13->index);
        }
        else {
          *(uint *)((file->tables).cur + 0x10) = pDVar13->index;
        }
        if (file->binary == 0) {
          pcVar49 = "";
          if (uVar50 < (g->passes).n - 1) {
            pcVar49 = ", ";
          }
          myfprintf(file->fp,"}%s",pcVar49);
        }
        else {
          ppcVar45 = &(file->tables).cur;
          *ppcVar45 = *ppcVar45 + file->elem_size;
        }
        uVar50 = uVar50 + 1;
      } while (uVar50 < (g->passes).n);
    }
    end_array(file,"\n\n");
    g->write_line = g->write_line + 2;
  }
  if (er_hash.v != er_hash.e && er_hash.v != (State **)0x0) {
    free(er_hash.v);
  }
  er_hash.n = 0;
  er_hash.v = (State **)0x0;
  pPVar20 = lookup_production(g,"whitespace",10);
  if (pPVar20 == (Production *)0x0) {
    uVar19 = 0;
  }
  else {
    uVar19 = pPVar20->state->index;
  }
  if (file->binary != 0) {
    file->d_parser_tables_loc = *(int *)&(file->tables).cur - *(int *)&(file->tables).start;
  }
  pcVar49 = make_name("parser_tables_%s",tag);
  start_struct_fn(file,0x48,"D_ParserTables",pcVar49,"\n");
  if (file->binary == 0) {
    if (file->first_member == 0) {
      myfprintf(file->fp,", ");
    }
    file->first_member = 0;
    myfprintf(file->fp,"%d",(ulong)(g->states).n);
  }
  else {
    *(uint *)(file->tables).cur = (g->states).n;
  }
  pcVar49 = (file->tables).cur;
  if (pcVar49 == (char *)0x0) {
    pOVar34 = get_offset(file,"d_states_%s",tag);
    ppvVar43 = (void **)0x0;
  }
  else {
    ppvVar43 = (void **)(pcVar49 + 8);
    pOVar34 = get_offset(file,"d_states_%s",tag);
  }
  add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
  pcVar49 = (file->tables).cur;
  if (pcVar49 == (char *)0x0) {
    pOVar34 = get_offset(file,"d_gotos_%s",tag);
    ppvVar43 = (void **)0x0;
  }
  else {
    ppvVar43 = (void **)(pcVar49 + 0x10);
    pOVar34 = get_offset(file,"d_gotos_%s",tag);
  }
  add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
  if (file->binary == 0) {
    if (file->first_member == 0) {
      myfprintf(file->fp,", ");
    }
    file->first_member = 0;
    myfprintf(file->fp,"%d",(ulong)uVar19);
  }
  else {
    *(uint *)((file->tables).cur + 0x18) = uVar19;
  }
  if (file->binary == 0) {
    if (file->first_member == 0) {
      myfprintf(file->fp,", ");
    }
    file->first_member = 0;
    myfprintf(file->fp,"%d",(ulong)((g->terminals).n + (g->productions).n));
  }
  else {
    *(uint *)((file->tables).cur + 0x1c) = (g->terminals).n + (g->productions).n;
  }
  pcVar49 = (file->tables).cur;
  if (pcVar49 == (char *)0x0) {
    pOVar34 = get_offset(file,"d_symbols_%s",tag);
    ppvVar43 = (void **)0x0;
  }
  else {
    ppvVar43 = (void **)(pcVar49 + 0x20);
    pOVar34 = get_offset(file,"d_symbols_%s",tag);
  }
  add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
  if (g->default_white_space == (char *)0x0) {
    pcVar49 = (file->tables).cur;
    if (pcVar49 == (char *)0x0) {
      ppvVar43 = (void **)0x0;
    }
    else {
      ppvVar43 = (void **)(pcVar49 + 0x28);
    }
    add_struct_ptr_member_fn(file,ppvVar43,&null_entry,"%s");
  }
  else {
    if (file->binary != 0) {
      __assert_fail("!file->binary",
                    "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                    ,0x6a6,"void write_parser_tables(Grammar *, char *, File *)");
    }
    myfprintf(file->fp,", %s");
  }
  if (file->binary == 0) {
    if (file->first_member == 0) {
      myfprintf(file->fp,", ");
    }
    file->first_member = 0;
    myfprintf(file->fp,"%d",(ulong)(g->passes).n);
  }
  else {
    *(uint *)((file->tables).cur + 0x30) = (g->passes).n;
  }
  pcVar49 = (file->tables).cur;
  if ((g->passes).n == 0) {
    if (pcVar49 == (char *)0x0) {
      pOVar34 = &null_entry;
      ppvVar43 = (void **)0x0;
    }
    else {
      ppvVar43 = (void **)(pcVar49 + 0x38);
      pOVar34 = &null_entry;
    }
  }
  else if (pcVar49 == (char *)0x0) {
    pOVar34 = get_offset(file,"d_passes_%s",tag);
    ppvVar43 = (void **)0x0;
  }
  else {
    ppvVar43 = (void **)(pcVar49 + 0x38);
    pOVar34 = get_offset(file,"d_passes_%s",tag);
  }
  add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"%s");
  if (g->save_parse_tree == 0) {
    if (file->binary != 0) {
      pcVar49 = (file->tables).cur;
      pcVar49[0x40] = '\0';
      pcVar49[0x41] = '\0';
      pcVar49[0x42] = '\0';
      pcVar49[0x43] = '\0';
      goto LAB_001386cf;
    }
    if (file->first_member == 0) {
      myfprintf(file->fp,", ");
    }
    file->first_member = 0;
    pFVar46 = file->fp;
    uVar35 = 0;
  }
  else {
    if (file->binary != 0) {
      pcVar49 = (file->tables).cur;
      pcVar49[0x40] = '\x01';
      pcVar49[0x41] = '\0';
      pcVar49[0x42] = '\0';
      pcVar49[0x43] = '\0';
      goto LAB_001386cf;
    }
    if (file->first_member == 0) {
      myfprintf(file->fp,", ");
    }
    file->first_member = 0;
    pFVar46 = file->fp;
    uVar35 = 1;
  }
  myfprintf(pFVar46,"%d",uVar35);
LAB_001386cf:
  if (file->binary == 0) {
    myfprintf(file->fp,"};%s","\n");
  }
  else {
    ppcVar45 = &(file->tables).cur;
    *ppcVar45 = *ppcVar45 + 0x48;
  }
  if (file->binary != 0) {
    if (file->str == (uint8 **)0x0) {
      pFVar29 = fopen(g->write_pathname,"wb");
      file->fp = (FILE *)pFVar29;
      if (pFVar29 == (FILE *)0x0) {
        d_fail("unable to open `%s` for write\n",g->pathname);
      }
    }
    final_code._0_4_ = (file->relocations).n;
    final_code._4_4_ = (file->str_relocations).n;
    final_code._8_4_ = file->d_parser_tables_loc;
    lVar31 = (long)(file->tables).cur - (long)(file->tables).start;
    final_code._12_4_ = (undefined4)lVar31;
    lVar52 = (long)(file->strings).cur - (long)(file->strings).start;
    final_code._16_4_ = (undefined4)lVar52;
    ppuVar14 = file->str;
    if (ppuVar14 != (uint8 **)0x0) {
      uVar50 = lVar52 + lVar31 + ((ulong)(uint)final_code._4_4_ + (ulong)(uint)final_code._0_4_) * 8
               + 0x14;
      puVar30 = (uint8 *)malloc(uVar50 & 0xffffffff);
      *ppuVar14 = puVar30;
      file->cur_str = puVar30;
      *file->str_len = (uint)uVar50;
    }
    write_chk(final_code,0x14,1,file);
    write_chk((file->tables).start,1,(long)(int)final_code._12_4_,file);
    write_chk((file->strings).start,1,(long)(int)final_code._16_4_,file);
    if ((file->relocations).n != 0) {
      lVar31 = 0;
      uVar50 = 0;
      do {
        write_chk((void *)((long)(file->relocations).v + lVar31),8,1,file);
        uVar50 = uVar50 + 1;
        lVar31 = lVar31 + 8;
      } while (uVar50 < (file->relocations).n);
    }
    if ((file->str_relocations).n != 0) {
      lVar31 = 0;
      uVar50 = 0;
      do {
        write_chk((void *)((long)(file->str_relocations).v + lVar31),8,1,file);
        uVar50 = uVar50 + 1;
        lVar31 = lVar31 + 8;
      } while (uVar50 < (file->str_relocations).n);
    }
  }
  pcVar49 = (file->tables).start;
  if (pcVar49 != (char *)0x0) {
    free(pcVar49);
  }
  pcVar49 = (file->strings).start;
  if (pcVar49 != (char *)0x0) {
    free(pcVar49);
  }
  ppcVar45 = (file->str_relocations).v;
  if (ppcVar45 != (file->str_relocations).e && ppcVar45 != (char **)0x0) {
    free(ppcVar45);
  }
  (file->str_relocations).n = 0;
  (file->str_relocations).v = (char **)0x0;
  ppcVar45 = (file->relocations).v;
  if (ppcVar45 != (file->relocations).e && ppcVar45 != (char **)0x0) {
    free(ppcVar45);
  }
  (file->relocations).n = 0;
  (file->relocations).v = (char **)0x0;
  if ((file->entries).n != 0) {
    uVar50 = 0;
    do {
      pOVar34 = (file->entries).v[uVar50];
      if (pOVar34 != (OffsetEntry *)0x0) {
        free(pOVar34->name);
        free((file->entries).v[uVar50]);
        (file->entries).v[uVar50] = (OffsetEntry *)0x0;
      }
      uVar50 = uVar50 + 1;
    } while (uVar50 < (file->entries).n);
  }
  __ptr = (file->entries).v;
  if (__ptr != (file->entries).e && __ptr != (OffsetEntry **)0x0) {
    free(__ptr);
  }
  (file->entries).n = 0;
  (file->entries).v = (OffsetEntry **)0x0;
  if ((FILE *)file->fp != (FILE *)0x0) {
    fclose((FILE *)file->fp);
  }
  return;
code_r0x001364d8:
  *(ulong *)(final_code._8_8_ + (ulong)uVar37 * 8) =
       (ulong)((pSVar7->gotos).v[lVar31]->state->index + 1);
  lVar31 = lVar31 + 1;
  lVar52 = lVar52 + 1;
  if ((int)(pSVar7->gotos).n <= lVar31) goto code_r0x001364ff;
  goto LAB_0013643b;
code_r0x001364ff:
  bVar15 = true;
LAB_0013654b:
  if (bVar15) goto code_r0x00136553;
  goto LAB_00136426;
code_r0x00136553:
  pSVar7->goto_table_offset = uVar41;
  pcVar49 = make_name("d_goto_valid_%d_%s",uVar53,tag);
  start_array_fn(file,1,"","unsigned char",pcVar49,"",0,"");
  if (file->binary == 0) {
    myfprintf(file->fp,"%s","\n");
  }
  g->write_line = g->write_line + 1;
  if (7 < uVar36) {
    uVar39 = 0;
    do {
      if (file->binary == 0) {
        pcVar49 = ",";
        if (uVar47 - 1 == uVar39) {
          pcVar49 = "";
        }
        myfprintf(file->fp,"0x%x%s",(ulong)*(byte *)((long)pvVar21 + uVar39),pcVar49);
      }
      else {
        file->n_elems = file->n_elems + 1;
        make_room_in_buf(&file->tables,(long)file->elem_size);
        *(file->tables).cur = *(char *)((long)pvVar21 + uVar39);
        ppcVar45 = &(file->tables).cur;
        *ppcVar45 = *ppcVar45 + file->elem_size;
      }
      uVar39 = uVar39 + 1;
    } while (uVar48 != uVar39);
  }
  end_array(file,"\n");
  g->write_line = g->write_line + 1;
LAB_0013667f:
  if ((pSVar7->reduce_actions).n != 0) {
    pcVar49 = make_name("d_reductions_%d_%s",uVar53,tag);
    start_array_fn(file,8,"","D_Reduction *",pcVar49,"",0,"");
    if ((pSVar7->reduce_actions).n != 0) {
      uVar39 = 0;
      do {
        pRVar42 = (pSVar7->reduce_actions).v[uVar39]->rule;
        pRVar33 = pRVar42->same_reduction;
        if (pRVar33 == (Rule *)0x0) {
          pRVar33 = pRVar42;
        }
        pOVar34 = get_offset(file,"d_reduction_%d_%s",(ulong)pRVar33->index,tag);
        add_array_ptr_member_fn
                  (file,pOVar34,"&%s%s",(uint)(uVar39 == (pSVar7->reduce_actions).n - 1));
        uVar39 = uVar39 + 1;
      } while (uVar39 < (pSVar7->reduce_actions).n);
    }
    end_array(file,"\n");
    g->write_line = g->write_line + 1;
  }
  if ((pSVar7->right_epsilon_hints).n != 0) {
    pcVar49 = make_name("d_right_epsilon_hints_%d_%s",uVar53,tag);
    start_array_fn(file,0x10,"","D_RightEpsilonHint",pcVar49,"",0,"");
    if ((pSVar7->right_epsilon_hints).n != 0) {
      uVar39 = 0;
      do {
        start_struct_in_array(file);
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)(pSVar7->right_epsilon_hints).v[uVar39]->depth);
        }
        else {
          *(short *)(file->tables).cur = (short)(pSVar7->right_epsilon_hints).v[uVar39]->depth;
        }
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)(pSVar7->right_epsilon_hints).v[uVar39]->state->index);
        }
        else {
          *(short *)((file->tables).cur + 2) =
               (short)(pSVar7->right_epsilon_hints).v[uVar39]->state->index;
        }
        pcVar49 = (file->tables).cur;
        if (pcVar49 == (char *)0x0) {
          pRVar42 = (pSVar7->right_epsilon_hints).v[uVar39]->rule;
          pRVar33 = pRVar42->same_reduction;
          if (pRVar33 == (Rule *)0x0) {
            pRVar33 = pRVar42;
          }
          pOVar34 = get_offset(file,"d_reduction_%d_%s",(ulong)pRVar33->index,tag);
          ppvVar43 = (void **)0x0;
        }
        else {
          ppvVar43 = (void **)(pcVar49 + 8);
          pRVar42 = (pSVar7->right_epsilon_hints).v[uVar39]->rule;
          pRVar33 = pRVar42->same_reduction;
          if (pRVar33 == (Rule *)0x0) {
            pRVar33 = pRVar42;
          }
          pOVar34 = get_offset(file,"d_reduction_%d_%s",(ulong)pRVar33->index,tag);
        }
        add_struct_ptr_member_fn(file,ppvVar43,pOVar34,"&%s");
        if (file->binary == 0) {
          pcVar49 = ",";
          if (uVar39 == (pSVar7->right_epsilon_hints).n - 1) {
            pcVar49 = "";
          }
          myfprintf(file->fp,"}%s",pcVar49);
        }
        else {
          ppcVar45 = &(file->tables).cur;
          *ppcVar45 = *ppcVar45 + file->elem_size;
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 < (pSVar7->right_epsilon_hints).n);
    }
    end_array(file,"\n");
    g->write_line = g->write_line + 1;
  }
  uVar53 = uVar53 + 1;
  if ((g->states).n <= uVar53) goto LAB_001369a8;
  goto LAB_00136358;
}

Assistant:

void write_parser_tables(Grammar *g, char *tag, File *file) {
  int whitespace_production = 0;
  VecState er_hash;
  Production *p;
  vec_clear(&er_hash);

  g->scanner_block_size = 256 / g->scanner_blocks;

  write_reductions(file, g, tag);
  write_scanner_data(file, g, tag);
  if (!file->binary) write_scanner_code(file, g, tag);
  write_goto_data(file, g, tag);
  write_error_data(file, g, &er_hash, tag);
  write_state_data(file, g, &er_hash, tag);
  write_symbol_data(file, g, tag);
  write_passes(file, g, tag);
  vec_free(&er_hash);

  if ((p = lookup_production(g, "whitespace", sizeof("whitespace") - 1))) whitespace_production = p->state->index;

  if (file->binary) {
    file->d_parser_tables_loc = file->tables.cur - file->tables.start;
  }

  start_struct(file, D_ParserTables, make_name("parser_tables_%s", tag), "\n");
  add_struct_member(file, D_ParserTables, "%d", g->states.n, nstates);
  add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_states_%s", tag), state);
  add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_gotos_%s", tag), goto_table);
  add_struct_member(file, D_ParserTables, "%d", whitespace_production, whitespace_state);
  add_struct_member(file, D_ParserTables, "%d", g->productions.n + g->terminals.n, nsymbols);
  add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_symbols_%s", tag), symbols);
  if (g->default_white_space) {
    assert(!file->binary);
    fprintf(file->fp, ", %s", g->default_white_space);
  } else {
    add_struct_ptr_member(file, D_ParserTables, "", &null_entry, default_white_space);
  }
  add_struct_member(file, D_ParserTables, "%d", g->passes.n, npasses);
  if (g->passes.n){
    add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_passes_%s", tag), passes);
  } else {
    add_struct_ptr_member(file, D_ParserTables, "", &null_entry, passes);
  }
  if (g->save_parse_tree) {
    add_struct_member(file, D_ParserTables, "%d", 1, save_parse_tree);
  } else {
    add_struct_member(file, D_ParserTables, "%d", 0, save_parse_tree);
  }
  end_struct(file, D_ParserTables, "\n");

  if (file->binary) {
    if (!file->str) {
      file->fp = fopen(g->write_pathname, "wb");
      if (!file->fp) d_fail("unable to open `%s` for write\n", g->pathname);
    }
    save_binary_tables(file);
  }
  free_tables(file);
  if (file->fp) fclose(file->fp);
}